

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int system(char *__command)

{
  __pid_t _Var1;
  __pid_t _Var2;
  char *argv [4];
  char *local_28;
  char *pcStack_20;
  char *local_18;
  undefined8 uStack_10;
  
  uStack_10 = 0;
  local_28 = "sh";
  pcStack_20 = "-c";
  if (__command != (char *)0x0) {
    local_18 = __command;
    _Var1 = fork();
    if (_Var1 == 0) {
      execve("/bin/sh",&local_28,(char **)0x0);
    }
    else if (0 < _Var1) {
      do {
        _Var2 = wait((void *)0x0);
      } while (_Var2 != _Var1);
    }
  }
  return -1;
}

Assistant:

int system( const char * string )
{
    const char * argv[] = { "sh", "-c", NULL, NULL };
    argv[2] = string;

    if ( string != NULL )
    {
        int pid = fork();

        if ( pid == 0 )
        {
            execve( "/bin/sh", ( char * const *)argv, NULL );
        }
        else if ( pid > 0 )
        {
            while ( wait( NULL ) != pid )
            {
                /* EMPTY */
            }
        }
    }

    return -1;
}